

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# observer.hpp
# Opt level: O2

void __thiscall
baryonyx::details::pi_file_observer::make_observation<long_double>
          (pi_file_observer *this,sparse_matrix<int> *param_1,longdouble *param_2,longdouble *pi)

{
  int iVar1;
  longdouble *plVar2;
  ulong uVar3;
  
  if (((&this->field_0x28)[*(long *)(*(long *)&this->m_ofs + -0x18)] & 5) != 0) {
    return;
  }
  iVar1 = this->m_len;
  std::ostream::_M_insert<long_double>(*pi);
  if (1 < iVar1) {
    plVar2 = pi + 1;
    for (uVar3 = 1; uVar3 != (uint)this->constraints; uVar3 = uVar3 + 1) {
      std::operator<<((ostream *)&this->m_ofs,' ');
      std::ostream::_M_insert<long_double>(*plVar2);
      plVar2 = plVar2 + 1;
    }
  }
  std::operator<<((ostream *)&this->m_ofs,'\n');
  return;
}

Assistant:

void make_observation(const sparse_matrix<int>& /*ap*/,
                          const Float* /*P*/,
                          const Float* pi)
    {
        static_assert(std::is_floating_point<Float>::value);

        if (m_ofs) {
            if (m_len > 1) {
                m_ofs << pi[0];

                for (int i = 1; i != constraints; ++i)
                    m_ofs << ' ' << pi[i];

            } else {
                m_ofs << pi[0];
            }

            m_ofs << '\n';
        }
    }